

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bgzf.c
# Opt level: O0

int bgzf_compress(void *_dst,int *dlen,void *src,int slen,int level)

{
  uint8_t *puVar1;
  int iVar2;
  undefined8 uVar3;
  uint8_t *dst;
  z_stream zs;
  uint32_t crc;
  int level_local;
  int slen_local;
  void *src_local;
  int *dlen_local;
  void *_dst_local;
  
  zs.state = (internal_state *)0x0;
  zs.zalloc = (alloc_func)0x0;
  zs.total_in = (long)_dst + 0x12;
  zs.next_out._0_4_ = *dlen + -0x1a;
  dst = (uint8_t *)src;
  zs.next_in._0_4_ = slen;
  iVar2 = deflateInit2_(&dst,level,8,0xfffffff1,8,0,"1.2.11",0x70);
  if (iVar2 == 0) {
    iVar2 = deflate(&dst,4);
    if (iVar2 == 1) {
      iVar2 = deflateEnd(&dst);
      if (iVar2 == 0) {
        *dlen = zs.avail_out + 0x1a;
        *(undefined8 *)_dst = 0x4088b1f;
        puVar1 = (uint8_t *)((long)_dst + 8);
        puVar1[0] = '\0';
        puVar1[1] = 0xff;
        puVar1[2] = '\x06';
        puVar1[3] = '\0';
        puVar1[4] = 'B';
        puVar1[5] = 'C';
        puVar1[6] = '\x02';
        puVar1[7] = '\0';
        *(undefined2 *)((long)_dst + 0x10) = 0;
        packInt16((uint8_t *)((long)_dst + 0x10),(short)*dlen - 1);
        uVar3 = crc32(0,0,0);
        zs.reserved._4_4_ = crc32(uVar3,src,slen);
        packInt32((uint8_t *)((long)_dst + (long)(*dlen + -8)),zs.reserved._4_4_);
        packInt32((uint8_t *)((long)_dst + (long)(*dlen + -4)),slen);
        _dst_local._4_4_ = 0;
      }
      else {
        _dst_local._4_4_ = -1;
      }
    }
    else {
      _dst_local._4_4_ = -1;
    }
  }
  else {
    _dst_local._4_4_ = -1;
  }
  return _dst_local._4_4_;
}

Assistant:

static int bgzf_compress(void *_dst, int *dlen, void *src, int slen, int level)
{
    uint32_t crc;
    z_stream zs;
    uint8_t *dst = (uint8_t*)_dst;

    // compress the body
    zs.zalloc = NULL; zs.zfree = NULL;
    zs.next_in  = (Bytef*)src;
    zs.avail_in = slen;
    zs.next_out = dst + BLOCK_HEADER_LENGTH;
    zs.avail_out = *dlen - BLOCK_HEADER_LENGTH - BLOCK_FOOTER_LENGTH;
    if (deflateInit2(&zs, level, Z_DEFLATED, -15, 8, Z_DEFAULT_STRATEGY) != Z_OK) return -1; // -15 to disable zlib header/footer
    if (deflate(&zs, Z_FINISH) != Z_STREAM_END) return -1;
    if (deflateEnd(&zs) != Z_OK) return -1;
    *dlen = zs.total_out + BLOCK_HEADER_LENGTH + BLOCK_FOOTER_LENGTH;
    // write the header
    memcpy(dst, g_magic, BLOCK_HEADER_LENGTH); // the last two bytes are a place holder for the length of the block
    packInt16(&dst[16], *dlen - 1); // write the compressed length; -1 to fit 2 bytes
    // write the footer
    crc = crc32(crc32(0L, NULL, 0L), (Bytef*)src, slen);
    packInt32((uint8_t*)&dst[*dlen - 8], crc);
    packInt32((uint8_t*)&dst[*dlen - 4], slen);
    return 0;
}